

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O1

UBool __thiscall
icu_63::UnicodeStringAppendable::appendCodePoint(UnicodeStringAppendable *this,UChar32 c)

{
  ulong uVar1;
  ulong in_RAX;
  UnicodeString *pUVar2;
  int32_t srcLength;
  bool bVar3;
  UChar buffer [2];
  undefined8 uStack_8;
  
  uStack_8._0_4_ = (undefined4)in_RAX;
  if ((uint)c < 0x10000) {
    uStack_8._6_2_ = (undefined2)(in_RAX >> 0x30);
    uStack_8._0_6_ = CONCAT24((short)c,(undefined4)uStack_8);
    bVar3 = true;
    srcLength = 1;
    uVar1 = uStack_8;
  }
  else {
    srcLength = 0;
    bVar3 = false;
    uVar1 = in_RAX;
    if ((uint)c < 0x110000) {
      uStack_8._0_6_ = CONCAT24((short)((uint)c >> 10) + -0x2840,(undefined4)uStack_8);
      uStack_8 = CONCAT26((short)c,(undefined6)uStack_8) & 0x3ffffffffffffff | 0xdc00000000000000;
      bVar3 = true;
      srcLength = 2;
      uVar1 = uStack_8;
    }
  }
  uStack_8 = uVar1;
  if (bVar3) {
    pUVar2 = UnicodeString::doAppend(this->str,(UChar *)((long)&uStack_8 + 4),0,srcLength);
    bVar3 = (undefined1  [56])((undefined1  [56])pUVar2->fUnion & (undefined1  [56])0x11) ==
            (undefined1  [56])0x0;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

UBool
UnicodeStringAppendable::appendCodePoint(UChar32 c) {
  UChar buffer[U16_MAX_LENGTH];
  int32_t cLength = 0;
  UBool isError = FALSE;
  U16_APPEND(buffer, cLength, U16_MAX_LENGTH, c, isError);
  return !isError && str.doAppend(buffer, 0, cLength).isWritable();
}